

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemImpl.cpp
# Opt level: O3

bool efsw::Platform::isLocalFUSEDirectory(string *directory)

{
  pointer pcVar1;
  bool bVar2;
  string devicePath;
  string local_60;
  string local_40;
  
  efsw::FileSystem::dirRemoveSlashAtEnd(directory);
  pcVar1 = (directory->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + directory->_M_string_length);
  findMountPoint(&local_40,&local_60);
  std::__cxx11::string::operator=((string *)directory,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (directory->_M_string_length == 0) {
    bVar2 = false;
  }
  else {
    findDevicePath(&local_40,directory);
    bVar2 = local_40._M_string_length != 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return bVar2;
}

Assistant:

bool isLocalFUSEDirectory( std::string directory ) {
	efsw::FileSystem::dirRemoveSlashAtEnd( directory );

	directory = findMountPoint( directory );

	if ( !directory.empty() ) {
		std::string devicePath = findDevicePath( directory );

		return !devicePath.empty();
	}

	return false;
}